

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printAssignName(JSPrinter *this,Ref node)

{
  long lVar1;
  
  lVar1 = cashew::Value::asAssignName();
  emit(this,*(char **)(lVar1 + 0x20));
  space(this);
  emit(this,'=');
  space(this);
  printChild(this,*(Value **)(lVar1 + 8),node,1);
  return;
}

Assistant:

void printAssignName(Ref node) {
    auto* assign = node->asAssignName();
    emit(assign->target().str.data());
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }